

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToolsTest.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  allocator<unsigned_char> *paVar1;
  pointer *ppuVar2;
  FILE *pFVar3;
  size_t sVar4;
  pointer puVar5;
  uint uVar6;
  size_type sVar7;
  uint64_t uVar8;
  reference pvVar9;
  byte *pbVar10;
  reference pvVar11;
  uint64_t *puVar12;
  unsigned_long uVar13;
  size_type sVar14;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *in_stack_fffffffffffff8e0;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> local_4a8;
  function<bool_(unsigned_long,_unsigned_long)> local_488;
  undefined1 local_468 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  found;
  anon_class_24_3_46dc24c6 is_equal_2;
  uint64_t target_value3;
  uint64_t target_value2;
  uint64_t target_value1;
  size_t x_5;
  size_t sum_2;
  size_t x_4;
  value_type local_3e0;
  undefined1 local_3d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> thread_counts_2;
  uint64_t duration_2;
  function<bool_(unsigned_long,_unsigned_long)> local_398;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  local_378;
  uint64_t local_340;
  uint64_t start_time_2;
  anon_class_8_1_898c8c3e handle_value_2;
  undefined1 local_328 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hits_2;
  function<bool_(unsigned_long,_unsigned_long)> local_2f0;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> local_2d0;
  function<bool_(unsigned_long,_unsigned_long)> local_2b0;
  anon_class_8_1_14e29341 local_290;
  anon_class_8_1_14e29341 is_equal_1;
  uint64_t target_value_1;
  size_t x_3;
  size_t sum_1;
  size_t x_2;
  value_type local_260;
  undefined1 local_258 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> thread_counts_1;
  uint64_t duration_1;
  function<bool_(unsigned_long,_unsigned_long)> local_218;
  uint64_t local_1f8;
  uint64_t start_time_1;
  anon_class_8_1_898c8c3e handle_value_1;
  undefined1 local_1e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hits_1;
  function<bool_(unsigned_long,_unsigned_long)> local_1a8;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> local_188;
  function<bool_(unsigned_long,_unsigned_long)> local_168;
  anon_class_8_1_14e29341 local_148;
  anon_class_8_1_14e29341 is_equal;
  uint64_t target_value;
  size_t x_1;
  size_t sum;
  size_t x;
  value_type local_118;
  undefined1 local_110 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> thread_counts;
  uint64_t duration;
  function<bool_(unsigned_long,_unsigned_long)> local_d0;
  uint64_t local_b0;
  uint64_t start_time;
  anon_class_8_1_898c8c3e handle_value;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hits;
  size_t num_threads;
  anon_class_8_1_4f9d58bb local_68;
  function<void_()> local_60;
  undefined1 local_40 [8];
  CallOnDestroy g1;
  bool called;
  char **param_8_local;
  int param_7_local;
  
  printf("-- on_close_scope\n");
  g1.f._M_invoker._7_1_ = 0;
  local_68.called = (bool *)((long)&g1.f._M_invoker + 7);
  std::function<void()>::function<main::__0,void>((function<void()> *)&local_60,&local_68);
  phosg::on_close_scope((CallOnDestroy *)local_40,&local_60);
  std::function<void_()>::~function(&local_60);
  phosg::expect_generic
            ((bool)(~g1.f._M_invoker._7_1_ & 1),"!(!called)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x11);
  phosg::CallOnDestroy::~CallOnDestroy((CallOnDestroy *)local_40);
  phosg::expect_generic
            ((bool)(g1.f._M_invoker._7_1_ & 1),"!(called)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x13);
  uVar6 = std::thread::hardware_concurrency();
  hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar6;
  printf("-- parallel_range\n");
  handle_value.hits._7_1_ = 0;
  paVar1 = (allocator<unsigned_char> *)((long)&handle_value.hits + 6);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,0x1000000,
             (value_type_conflict1 *)((long)&handle_value.hits + 7),paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&handle_value.hits + 6));
  start_time = (uint64_t)local_98;
  local_b0 = phosg::now();
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__1&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_d0,
             (anon_class_8_1_898c8c3e *)&start_time);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration,(nullptr_t)0x0);
  phosg::parallel_range<unsigned_long>
            (&local_d0,0,sVar7,(size_t)puVar5,
             (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_d0);
  uVar8 = phosg::now();
  thread_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(uVar8 - local_b0);
  fprintf(_stderr,"---- time: %lu\n",
          thread_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_118 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&x + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,(size_type)puVar5,
             &local_118,(allocator<unsigned_long> *)((long)&x + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&x + 7));
  sum = 0;
  while( true ) {
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    if (sVar7 <= sum) break;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,sum);
    phosg::expect_generic
              (*pvVar9 != '\0',"hits[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x26);
    pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,sum);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,
                         (ulong)*pbVar10 - 1);
    *pvVar11 = *pvVar11 + 1;
    sum = sum + 1;
  }
  x_1 = 0;
  target_value = 0;
  while( true ) {
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110);
    if (sVar7 <= target_value) break;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,
                         target_value);
    phosg::expect_generic
              (*pvVar11 != 0,"thread_counts[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x2c);
    pFVar3 = _stderr;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,
                         target_value);
    fprintf(pFVar3,"---- thread %zu: %zu\n",target_value,*pvVar11);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,
                         target_value);
    x_1 = *pvVar11 + x_1;
    target_value = target_value + 1;
  }
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  phosg::expect_generic
            (x_1 == sVar7,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  printf("-- parallel_range return value\n");
  is_equal.target_value = (uint64_t *)0xc349;
  local_148.target_value = (uint64_t *)&is_equal;
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__2&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_168,&local_148);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            (&local_188,(nullptr_t)0x0);
  puVar12 = (uint64_t *)
            phosg::parallel_range<unsigned_long>(&local_168,0,0x10000,(size_t)puVar5,&local_188);
  phosg::expect_generic
            (puVar12 == is_equal.target_value,
             "(parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)) != target_value"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x39);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            (&local_188);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_168);
  is_equal.target_value = (uint64_t *)0xcc349;
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__2&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_1a8,&local_148);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  ppuVar2 = &hits_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)ppuVar2,
             (nullptr_t)0x0);
  uVar13 = phosg::parallel_range<unsigned_long>
                     (&local_1a8,0,0x10000,(size_t)puVar5,
                      (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *
                      )ppuVar2);
  phosg::expect_generic
            (uVar13 == 0x10000,
             "(parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)) != 0x10000",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x40);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &hits_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_1a8);
  printf("-- parallel_range_blocks\n");
  handle_value_1.hits._7_1_ = 0;
  paVar1 = (allocator<unsigned_char> *)((long)&handle_value_1.hits + 6);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0,0x1000000,
             (value_type_conflict1 *)((long)&handle_value_1.hits + 7),paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&handle_value_1.hits + 6));
  start_time_1 = (uint64_t)local_1e0;
  local_1f8 = phosg::now();
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__3&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_218,
             (anon_class_8_1_898c8c3e *)&start_time_1);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration_1,(nullptr_t)0x0);
  phosg::parallel_range_blocks<unsigned_long>
            (&local_218,0,sVar7,0x1000,(size_t)puVar5,
             (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration_1);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration_1);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_218);
  uVar8 = phosg::now();
  thread_counts_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(uVar8 - local_1f8);
  fprintf(_stderr,"---- time: %lu\n",
          thread_counts_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_260 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&x_2 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258,(size_type)puVar5,
             &local_260,(allocator<unsigned_long> *)((long)&x_2 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&x_2 + 7));
  sum_1 = 0;
  while( true ) {
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
    if (sVar7 <= sum_1) break;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0,sum_1);
    phosg::expect_generic
              (*pvVar9 != '\0',"hits[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x51);
    pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0,sum_1);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258,
                         (ulong)*pbVar10 - 1);
    *pvVar11 = *pvVar11 + 1;
    sum_1 = sum_1 + 1;
  }
  x_3 = 0;
  target_value_1 = 0;
  while( true ) {
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258);
    if (sVar7 <= target_value_1) break;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258,
                         target_value_1);
    phosg::expect_generic
              (*pvVar11 != 0,"thread_counts[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x57);
    pFVar3 = _stderr;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258,
                         target_value_1);
    fprintf(pFVar3,"---- thread %zu: %zu\n",target_value_1,*pvVar11);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258,
                         target_value_1);
    x_3 = *pvVar11 + x_3;
    target_value_1 = target_value_1 + 1;
  }
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
  phosg::expect_generic
            (x_3 == sVar7,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x5b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
  printf("-- parallel_range_blocks return value\n");
  is_equal_1.target_value = (uint64_t *)0xc349;
  local_290.target_value = (uint64_t *)&is_equal_1;
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__4&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_2b0,&local_290);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            (&local_2d0,(nullptr_t)0x0);
  puVar12 = (uint64_t *)
            phosg::parallel_range_blocks<unsigned_long>
                      (&local_2b0,0,0x100000,0x1000,(size_t)puVar5,&local_2d0);
  phosg::expect_generic
            (puVar12 == is_equal_1.target_value,
             "(parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)) != target_value"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,100);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            (&local_2d0);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_2b0);
  is_equal_1.target_value = (uint64_t *)0xccc349;
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__4&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_2f0,&local_290);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  ppuVar2 = &hits_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)ppuVar2,
             (nullptr_t)0x0);
  uVar13 = phosg::parallel_range_blocks<unsigned_long>
                     (&local_2f0,0,0x100000,0x1000,(size_t)puVar5,
                      (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *
                      )ppuVar2);
  phosg::expect_generic
            (uVar13 == 0x100000,
             "(parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)) != 0x100000"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x6b);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &hits_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_2f0);
  printf("-- parallel_range_blocks_multi\n");
  handle_value_2.hits._7_1_ = 0;
  paVar1 = (allocator<unsigned_char> *)((long)&handle_value_2.hits + 6);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328,0x1000000,
             (value_type_conflict1 *)((long)&handle_value_2.hits + 7),paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&handle_value_2.hits + 6));
  start_time_2 = (uint64_t)local_328;
  local_340 = phosg::now();
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__5&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_398,
             (anon_class_8_1_898c8c3e *)&start_time_2);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration_2,(nullptr_t)0x0);
  phosg::
  parallel_range_blocks_multi<unsigned_long,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            (&local_378,(phosg *)&local_398,(function<bool_(unsigned_long,_unsigned_long)> *)0x0,
             sVar7,0x1000,(unsigned_long)puVar5,(size_t)&duration_2,in_stack_fffffffffffff8e0);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set(&local_378);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &duration_2);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_398);
  uVar8 = phosg::now();
  thread_counts_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(uVar8 - local_340);
  fprintf(_stderr,"---- time: %lu\n",
          thread_counts_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_3e0 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&x_4 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,(size_type)puVar5,
             &local_3e0,(allocator<unsigned_long> *)((long)&x_4 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&x_4 + 7));
  sum_2 = 0;
  while( true ) {
    sVar4 = sum_2;
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
    if (sVar7 <= sVar4) break;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328,sum_2);
    phosg::expect_generic
              (*pvVar9 != '\0',"hits[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x7c);
    pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328,sum_2);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,
                         (ulong)*pbVar10 - 1);
    *pvVar11 = *pvVar11 + 1;
    sum_2 = sum_2 + 1;
  }
  x_5 = 0;
  target_value1 = 0;
  while( true ) {
    uVar8 = target_value1;
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8);
    sVar4 = x_5;
    if (sVar7 <= uVar8) break;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,
                         target_value1);
    phosg::expect_generic
              (*pvVar11 != 0,"thread_counts[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x82);
    uVar8 = target_value1;
    pFVar3 = _stderr;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,
                         target_value1);
    fprintf(pFVar3,"---- thread %zu: %zu\n",uVar8,*pvVar11);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,
                         target_value1);
    x_5 = *pvVar11 + x_5;
    target_value1 = target_value1 + 1;
  }
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
  phosg::expect_generic
            (sVar4 == sVar7,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x86);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328);
  printf("-- parallel_range_blocks_multi return value\n");
  target_value2 = 0xc349;
  target_value3 = 0x53a0;
  is_equal_2.target_value3 = (uint64_t *)0x34d;
  found._M_h._M_single_bucket = (__node_base_ptr)&target_value2;
  is_equal_2.target_value1 = &target_value3;
  is_equal_2.target_value2 = (uint64_t *)&is_equal_2.target_value3;
  std::function<bool(unsigned_long,unsigned_long)>::function<main::__6&,void>
            ((function<bool(unsigned_long,unsigned_long)> *)&local_488,
             (anon_class_24_3_46dc24c6 *)&found._M_h._M_single_bucket);
  puVar5 = hits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            (&local_4a8,(nullptr_t)0x0);
  phosg::
  parallel_range_blocks_multi<unsigned_long,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)local_468,(phosg *)&local_488,(function<bool_(unsigned_long,_unsigned_long)> *)0x0,
             0x100000,0x1000,(unsigned_long)puVar5,(size_t)&local_4a8,in_stack_fffffffffffff8e0);
  std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            (&local_4a8);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_488);
  sVar14 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_468);
  phosg::expect_generic
            (sVar14 == 3,"3 != found.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x92);
  sVar14 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::count((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_468,&target_value2);
  phosg::expect_generic
            (sVar14 != 0,"!(found.count(target_value1))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x93);
  sVar14 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::count((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_468,&target_value3);
  phosg::expect_generic
            (sVar14 != 0,"!(found.count(target_value2))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x94);
  sVar14 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::count((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_468,(key_type *)&is_equal_2.target_value3);
  phosg::expect_generic
            (sVar14 != 0,"!(found.count(target_value3))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x95);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_468);
  printf("ToolsTest: all tests passed\n");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    printf("-- on_close_scope\n");
    bool called = false;
    {
      auto g1 = on_close_scope([&]() {
        called = true;
      });
      expect(!called);
    }
    expect(called);
  }

  const size_t num_threads = thread::hardware_concurrency();

  {
    printf("-- parallel_range\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range<uint64_t>(handle_value, 0, hits.size(), num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range return value\n");
    uint64_t target_value = 0xC349;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return (v == target_value);
    };
    expect_eq((parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)), target_value);
    // Note: We can't check that parallel_range ends early when fn returns true
    // because it's not actually guaranteed to do so - it's only guaranteed to
    // return any of the values for which fn returns true. One could imagine a sequence of events in
    // which the target value's call takes a very long time, and all other threads
    // could finish checking all other values before the target one returns true.
    target_value = 0xCC349; // > end_value; should not be found
    expect_eq((parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)), 0x10000);
  }

  {
    printf("-- parallel_range_blocks\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range_blocks<uint64_t>(handle_value, 0, hits.size(), 0x1000, num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range_blocks return value\n");
    uint64_t target_value = 0xC349;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return (v == target_value);
    };
    expect_eq((parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)), target_value);
    // Note: We can't check that parallel_range ends early when fn returns true
    // because it's not actually guaranteed to do so - it's only guaranteed to
    // return any of the values for which fn returns true. One could imagine a sequence of events in
    // which the target value's call takes a very long time, and all other threads
    // could finish checking all other values before the target one returns true.
    target_value = 0xCCC349; // > end_value; should not be found
    expect_eq((parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)), 0x100000);
  }

  {
    printf("-- parallel_range_blocks_multi\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range_blocks_multi<uint64_t>(handle_value, 0, hits.size(), 0x1000, num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range_blocks_multi return value\n");
    uint64_t target_value1 = 0xC349;
    uint64_t target_value2 = 0x53A0;
    uint64_t target_value3 = 0x034D;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return ((v == target_value1) || (v == target_value2) || (v == target_value3));
    };
    auto found = parallel_range_blocks_multi<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr);
    expect_eq(3, found.size());
    expect(found.count(target_value1));
    expect(found.count(target_value2));
    expect(found.count(target_value3));
  }

  printf("ToolsTest: all tests passed\n");
  return 0;
}